

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_dispatch.c
# Opt level: O2

int mpt_connection_dispatch(mpt_connection *con,mpt_event_handler_t cmd,void *arg)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  mpt_buffer *pmVar4;
  mpt_stream *srm;
  int iVar5;
  ulong uVar6;
  mpt_metatype *pmVar7;
  long lVar8;
  mpt_buffer *pmVar9;
  ulong len;
  ulong len_00;
  mpt_reply_data *rd;
  mpt_buffer *local_b0;
  mpt_msgtype hdr;
  mpt_event ev;
  _streamWrapper sw;
  mpt_message msg;
  
  ev.reply = (mpt_reply_context *)0x0;
  ev.msg = (mpt_message *)0x0;
  ev.id = 0;
  msg.cont = (iovec *)0x0;
  msg.clen = 0;
  msg.used = 0;
  msg.base = (void *)0x0;
  bVar2 = (con->out).state;
  if ((bVar2 & 0x10) != 0) {
    return 0x10000;
  }
  if ((con->out).sock._id < 0) {
    srm = (mpt_stream *)(con->out).buf._buf;
    if (srm != (mpt_stream *)0x0) {
      iVar5 = mpt_stream_dispatch(srm,streamWrapper,&sw);
      return iVar5;
    }
    return -1;
  }
  if ((bVar2 & 0x20) == 0) {
    return 0x10000;
  }
  (con->out).state = bVar2 & 0xcf;
  pmVar4 = (con->out).buf._buf;
  if (pmVar4 == (mpt_buffer *)0x0) {
    if (cmd == (mpt_event_handler_t)0x0) {
      return 0;
    }
LAB_00104d2c:
    iVar5 = (*cmd)(arg,&ev);
    return iVar5;
  }
  bVar2 = (con->out)._idlen;
  bVar3 = (con->out)._smax;
  len_00 = (ulong)bVar3;
  len = (ulong)((uint)bVar3 + (uint)bVar2);
  uVar6 = pmVar4->_used;
  sw.con = (mpt_connection *)(uVar6 - len);
  if (uVar6 < len) {
    mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%u < %u)","datagram too small",len,
            uVar6 & 0xffffffff);
    mpt_outdata_reply(&con->out,len_00,pmVar4 + 1,(mpt_message *)0x0);
    return -2;
  }
  if (cmd == (mpt_event_handler_t)0x0) {
    pmVar4->_used = 0;
    mpt_outdata_reply(&con->out,len,pmVar4 + 1,(mpt_message *)0x0);
    return 0;
  }
  pmVar9 = pmVar4 + 1;
  if (bVar2 == 0) {
    ev.msg = (mpt_message *)&sw;
    sw.arg = (void *)0x0;
    sw.cmd = (mpt_event_handler_t)((long)&pmVar9->_vptr + len);
    goto LAB_00104d2c;
  }
  if ((char)*(byte *)&pmVar9->_vptr < '\0') {
    sw.arg = (void *)0x0;
    *(byte *)&pmVar9->_vptr = *(byte *)&pmVar9->_vptr & 0x7f;
    iVar5 = mpt_message_buf2id((long)&pmVar9->_vptr + len_00,bVar2,&rd);
    if (iVar5 < 0) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","bad message length",bVar2);
      pmVar4->_used = len_00;
      return -2;
    }
    lVar8 = mpt_command_get(&con->_wait,rd);
    if (lVar8 == 0) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s (lx)","reply processing failed",
              "message not registered",rd);
    }
    else {
      sw.cmd = (mpt_event_handler_t)((long)&pmVar9->_vptr + len);
      sw.con = (mpt_connection *)(pmVar4->_used - len);
      iVar5 = (**(code **)(lVar8 + 8))(*(undefined8 *)(lVar8 + 0x10));
      if (-1 < iVar5) {
        return 0;
      }
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s (%i)","reply processing failed",iVar5
             );
    }
    return -0x11;
  }
  uVar6 = 0;
  do {
    if (bVar2 == uVar6) goto LAB_00104e79;
    pcVar1 = (char *)((long)&pmVar9->_vptr + uVar6);
    uVar6 = uVar6 + 1;
  } while (*pcVar1 == '\0');
  pmVar7 = con->_rctx;
  local_b0 = pmVar9;
  if (pmVar7 == (mpt_metatype *)0x0) {
    pmVar7 = (mpt_metatype *)mpt_reply_deferrable(len,replyConnection,con);
    if (pmVar7 == (mpt_metatype *)0x0) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",4,"%s: %s","dispatch incomplete",
              "no context available");
      pmVar9 = local_b0;
LAB_00104e79:
      sw.con = (mpt_connection *)0x0;
      rd = (mpt_reply_data *)0x0;
      ev.reply = (mpt_reply_context *)0x0;
      goto LAB_00104e8b;
    }
    con->_rctx = pmVar7;
  }
  sw.con = (mpt_connection *)0x0;
  rd = (mpt_reply_data *)0x0;
  iVar5 = (*(pmVar7->_vptr->convertable).convert)((mpt_convertable *)pmVar7,8,&rd);
  if ((iVar5 < 0) || (rd == (mpt_reply_data *)0x0)) {
    ev.reply = (mpt_reply_context *)0x0;
    pmVar9 = local_b0;
  }
  else {
    (*(pmVar7->_vptr->convertable).convert)((mpt_convertable *)pmVar7,0x82,&sw);
    ev.reply = (mpt_reply_context *)sw.con;
    pmVar9 = local_b0;
    if ((sw.con != (mpt_connection *)0x0) &&
       (iVar5 = mpt_reply_set(rd,(ulong)bVar2,local_b0), pmVar9 = local_b0, iVar5 < 0)) {
      mpt_log(0,"mpt::connection::dispatch<mpt::output>",3,"%s: %s","dispatch failed",
              "context not ready");
      return -4;
    }
  }
LAB_00104e8b:
  msg.base = (void *)((long)&pmVar9->_vptr + len);
  ev.msg = &msg;
  msg.used = pmVar4->_used - len;
  iVar5 = (*cmd)(arg,&ev);
  if ((sw.con != (mpt_connection *)0x0) && (rd->len != 0)) {
    msg.base = &hdr;
    hdr.cmd = '\x01';
    hdr.arg = (int8_t)iVar5;
    msg.used = 2;
    msg.cont = (iovec *)0x0;
    (*(code *)(((sw.con)->out).buf._buf)->_vptr)();
  }
  return iVar5;
}

Assistant:

extern int mpt_connection_dispatch(MPT_STRUCT(connection) *con, MPT_TYPE(event_handler) cmd, void *arg)
{
	static const char _func[] = "mpt::connection::dispatch<mpt::output>";
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(event) ev = MPT_EVENT_INIT;
	MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
	uint8_t *data;
	uint16_t hlen;
	uint8_t ilen, slen;
	
	/* message transfer in progress */
	if (con->out.state & MPT_OUTFLAG(Active)) {
		return MPT_EVENTFLAG(Retry);
	}
	if (!MPT_socket_active(&con->out.sock)) {
		struct _streamWrapper sw;
		
		if (!(buf = con->out.buf._buf)) {
			return MPT_ERROR(BadArgument);
		}
		return mpt_stream_dispatch((void *) buf, streamWrapper, &sw);
	}
	/* no new data present */
	if (!(con->out.state & MPT_OUTFLAG(Received))) {
		return MPT_EVENTFLAG(Retry);
	}
	con->out.state &= ~MPT_OUTFLAG(Received);
	
	/* no message data */
	if (!(buf = con->out.buf._buf)) {
		return cmd ? cmd(arg, &ev) : 0;
	}
	ilen = con->out._idlen;
	slen = con->out._smax;
	hlen = ilen + slen;
	
	if ((size_t) hlen > buf->_used) {
		mpt_log(0, _func, MPT_LOG(Error), "%s (%u < %u)", MPT_tr("datagram too small"), hlen, (int) buf->_used);
		mpt_outdata_reply(&con->out, slen, buf + 1, 0);
		return MPT_ERROR(BadValue);
	}
	/* discard existing message */
	if (!cmd) {
		buf->_used = 0;
		mpt_outdata_reply(&con->out, hlen, buf + 1, 0);
		return 0;
	}
	data = (void *) (buf + 1);
	/* no message id */
	if (!ilen) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		return cmd(arg, &ev);
	}
	/* got reply message */
	if (data[0] & 0x80) {
		MPT_STRUCT(message) msg = MPT_MESSAGE_INIT;
		MPT_STRUCT(command) *ans;
		uint64_t id;
		int len;
		data[0] &= 0x7f;
		if ((len = mpt_message_buf2id(data + slen, ilen, &id)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("bad message length"), (int) ilen);
			buf->_used = slen;
			return MPT_ERROR(BadValue);
		}
		if (!(ans = mpt_command_get(&con->_wait, id))) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s (" PRIx64 ")",
			        MPT_tr("reply processing failed"), MPT_tr("message not registered"), id);
			return MPT_ERROR(MissingBuffer);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		if ((len = ans->cmd(ans->arg, &msg)) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s (%i)",
			        MPT_tr("reply processing failed"), len);
			return MPT_ERROR(MissingBuffer);
		}
		return 0;
	}
	else {
		MPT_INTERFACE(metatype) *ctx = 0;
		MPT_INTERFACE(reply_context) *rc;
		MPT_STRUCT(reply_data) *rd;
		int ret;
		uint8_t i;
		
		/* need processing */
		for (i = 0; i < ilen; ++i) {
			if (!data[i]) {
				continue;
			}
			/* reply context required */
			if ((ctx = con->_rctx)) {
				break;
			}
			if (!(ctx = mpt_reply_deferrable(hlen, replyConnection, con))) {
				mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
				        MPT_tr("dispatch incomplete"), MPT_tr("no context available"));
				break;
			}
			con->_rctx = ctx;
			break;
		}
		/* get reply data and interface for reference */
		rc = 0;
		rd = 0;
		if (ctx
		    && MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyDataPtr), &rd) >= 0
		    && rd) {
			MPT_metatype_convert(ctx, MPT_ENUM(TypeReplyPtr), &rc);
		}
		if ((ev.reply = rc) && mpt_reply_set(rd, ilen, data) < 0) {
			mpt_log(0, _func, MPT_LOG(Error), "%s: %s",
			        MPT_tr("dispatch failed"), MPT_tr("context not ready"));
			return MPT_ERROR(BadOperation);
		}
		msg.base = data + hlen;
		msg.used = buf->_used - hlen;
		ev.msg = &msg;
		
		ret = cmd(arg, &ev);
		
		if (rc && rd->len) {
			MPT_STRUCT(msgtype) hdr;
			hdr.cmd = MPT_MESGTYPE(Answer);
			hdr.arg = ret;
			msg.base = &hdr;
			msg.used = sizeof(hdr);
			msg.cont = 0;
			rc->_vptr->reply(rc, &msg);
		}
		return ret;
	}
}